

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack.cpp
# Opt level: O3

bool goodform::msgpack::deserialize(istream *input,any *v)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  *pmVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  mapped_type *pmVar7;
  long *plVar8;
  byte *pbVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  uint32_t sz_be;
  any key;
  allocator_type local_71;
  double local_70;
  undefined1 local_68 [8];
  _Storage _Stack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _Storage *local_48;
  size_t local_40;
  ulong local_38;
  
  uVar3 = std::istream::get();
  bVar13 = *(int *)(input + *(long *)(*(long *)input + -0x18) + 0x20) == 0;
  if (!bVar13) goto LAB_0012e6a3;
  uVar4 = uVar3 & 0xff;
  bVar1 = (byte)uVar3;
  if (uVar4 < 0x80) {
    local_68 = (undefined1  [8])(CONCAT71(local_68._1_7_,bVar1) & 0xffffffffffffff7f);
    std::any::operator=(v,local_68);
    goto LAB_0012e6e4;
  }
  if (0xdf < uVar4) {
    local_68[0] = -(bVar1 & 0x1f);
    std::any::operator=(v,local_68);
    goto LAB_0012e6e4;
  }
  if (uVar4 < 0x90) {
    local_58._8_8_ = &_Stack_60;
    local_68 = (undefined1  [8])0x0;
    _Stack_60._M_ptr = (void *)0x0;
    local_58._M_allocated_capacity = 0;
    local_40 = 0;
    local_48 = (_Storage *)local_58._8_8_;
    std::any::operator=(v,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                           *)local_68);
    uVar11 = (ulong)(uVar3 & 0xf);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                 *)local_68);
    if (uVar11 != 0) {
      do {
        local_68 = (undefined1  [8])0x0;
        _Stack_60._M_ptr = (void *)0x0;
        bVar13 = deserialize(input,(any *)local_68);
        if ((bVar13) && (bVar13 = is<std::__cxx11::string>((any *)local_68), bVar13)) {
          pmVar5 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                             (v);
          pbVar6 = get<std::__cxx11::string>((any *)local_68);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                   ::operator[](pmVar5,pbVar6);
          bVar13 = deserialize(input,pmVar7);
        }
        else {
          bVar13 = false;
        }
        if (local_68 != (undefined1  [8])0x0) {
          (*(code *)local_68)(3,(any *)local_68,0);
        }
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
      return bVar13;
    }
    goto LAB_0012e6e4;
  }
  if (uVar4 < 0xa0) {
    uVar3 = uVar3 & 0xf;
    std::vector<std::any,_std::allocator<std::any>_>::vector
              ((vector<std::any,_std::allocator<std::any>_> *)local_68,(ulong)uVar3,
               (allocator_type *)&local_70);
    if ((ulong)uVar3 != 0) {
      uVar11 = 0;
      do {
        deserialize(input,(any *)((long)local_68 + uVar11));
        uVar11 = uVar11 + 0x10;
      } while (uVar3 << 4 != uVar11);
    }
    std::any::operator=(v,(vector<std::any,_std::allocator<std::any>_> *)local_68);
    goto LAB_0012e807;
  }
  if (uVar4 < 0xc0) {
    local_68 = (undefined1  [8])&local_58;
    _Stack_60._M_ptr = (void *)0x0;
    local_58._M_allocated_capacity = local_58._M_allocated_capacity & 0xffffffffffffff00;
    std::__cxx11::string::resize((ulong)local_68,bVar1 & 0x1f);
    std::istream::read((char *)input,(long)local_68);
    if (*(int *)(input + *(long *)(*(long *)input + -0x18) + 0x20) == 0) {
      bVar13 = true;
      std::any::operator=(v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_68);
    }
    else {
LAB_0012e867:
      bVar13 = false;
    }
LAB_0012e8b8:
    if (local_68 == (undefined1  [8])&local_58) {
      return bVar13;
    }
LAB_0012e8c6:
    pbVar9 = (byte *)(local_58._M_allocated_capacity + 1);
    goto LAB_0012e8ce;
  }
  bVar13 = false;
  switch(uVar3 & 0xff) {
  case 0xc0:
    local_68 = (undefined1  [8])0x0;
    std::any::operator=(v,(void **)local_68);
    goto LAB_0012e6e4;
  case 0xc2:
    local_68 = (undefined1  [8])((ulong)(uint7)local_68._1_7_ << 8);
    goto LAB_0012ee39;
  case 0xc3:
    local_68[0] = 1;
LAB_0012ee39:
    std::any::operator=(v,(bool *)local_68);
    goto LAB_0012e6e4;
  case 0xc4:
    bVar1 = std::istream::get();
    if (*(int *)(input + *(long *)(*(long *)input + -0x18) + 0x20) == 0) {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_68,(ulong)bVar1,
                 (allocator_type *)&local_70);
      plVar8 = (long *)std::istream::read((char *)input,(long)local_68);
      if (*(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) == 0) {
        bVar13 = true;
        std::any::operator=(v,(vector<char,_std::allocator<char>_> *)local_68);
      }
      else {
LAB_0012ee14:
        bVar13 = false;
      }
LAB_0012ee16:
      if (local_68 == (undefined1  [8])0x0) {
        return bVar13;
      }
      pbVar9 = (byte *)(local_58._M_allocated_capacity - (long)local_68);
LAB_0012e8ce:
      operator_delete((void *)local_68,(ulong)pbVar9);
      return bVar13;
    }
    goto LAB_0012e6a3;
  case 0xc5:
    plVar8 = (long *)std::istream::read((char *)input,(long)&local_70);
    if (*(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) == 0) {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_68,
                 (ulong)(ushort)(local_70._0_2_ << 8 | local_70._0_2_ >> 8),&local_71);
      plVar8 = (long *)std::istream::read((char *)input,(long)local_68);
      if (*(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) != 0) goto LAB_0012ee14;
      bVar13 = true;
      std::any::operator=(v,(vector<char,_std::allocator<char>_> *)local_68);
      goto LAB_0012ee16;
    }
    goto LAB_0012e6a3;
  case 0xc6:
    plVar8 = (long *)std::istream::read((char *)input,(long)&local_70);
    if (*(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) == 0) {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_68,
                 (ulong)(local_70._0_4_ >> 0x18 | (local_70._0_4_ & 0xff0000) >> 8 |
                         (local_70._0_4_ & 0xff00) << 8 | local_70._0_4_ << 0x18),&local_71);
      plVar8 = (long *)std::istream::read((char *)input,(long)local_68);
      if (*(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) != 0) goto LAB_0012ee14;
      bVar13 = true;
      std::any::operator=(v,(vector<char,_std::allocator<char>_> *)local_68);
      goto LAB_0012ee16;
    }
    goto LAB_0012e6a3;
  case 0xca:
    plVar8 = (long *)std::istream::read((char *)input,(long)local_68);
    bVar13 = *(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) == 0;
    if (bVar13) {
      local_70 = (double)CONCAT44(local_70._4_4_,
                                  (uint)local_68._0_4_ >> 0x18 | (local_68._0_4_ & 0xff0000) >> 8 |
                                  (local_68._0_4_ & 0xff00) << 8 | local_68._0_4_ << 0x18);
      std::any::operator=(v,(float *)&local_70);
    }
    break;
  case 0xcb:
    plVar8 = (long *)std::istream::read((char *)input,(long)local_68);
    bVar13 = *(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) == 0;
    if (bVar13) {
      local_70 = (double)((ulong)local_68 >> 0x38 | ((ulong)local_68 & 0xff000000000000) >> 0x28 |
                          ((ulong)local_68 & 0xff0000000000) >> 0x18 |
                          ((ulong)local_68 & 0xff00000000) >> 8 |
                          ((ulong)local_68 & 0xff000000) << 8 | ((ulong)local_68 & 0xff0000) << 0x18
                          | ((ulong)local_68 & 0xff00) << 0x28 | (long)local_68 << 0x38);
      std::any::operator=(v,&local_70);
    }
    break;
  case 0xcc:
    plVar8 = (long *)std::istream::read((char *)input,(long)local_68);
    bVar13 = *(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) == 0;
    if (bVar13) {
      std::any::operator=(v,local_68);
    }
    break;
  case 0xcd:
    plVar8 = (long *)std::istream::read((char *)input,(long)local_68);
    bVar13 = *(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) == 0;
    if (bVar13) {
      local_70 = (double)CONCAT62(local_70._2_6_,local_68._0_2_ << 8 | (ushort)local_68._0_2_ >> 8);
      std::any::operator=(v,(unsigned_short *)&local_70);
    }
    break;
  case 0xce:
    plVar8 = (long *)std::istream::read((char *)input,(long)local_68);
    bVar13 = *(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) == 0;
    if (bVar13) {
      local_70 = (double)CONCAT44(local_70._4_4_,
                                  (uint)local_68._0_4_ >> 0x18 | (local_68._0_4_ & 0xff0000) >> 8 |
                                  (local_68._0_4_ & 0xff00) << 8 | local_68._0_4_ << 0x18);
      std::any::operator=(v,(uint *)&local_70);
    }
    break;
  case 0xcf:
    plVar8 = (long *)std::istream::read((char *)input,(long)local_68);
    bVar13 = *(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) == 0;
    if (bVar13) {
      local_70 = (double)((ulong)local_68 >> 0x38 | ((ulong)local_68 & 0xff000000000000) >> 0x28 |
                          ((ulong)local_68 & 0xff0000000000) >> 0x18 |
                          ((ulong)local_68 & 0xff00000000) >> 8 |
                          ((ulong)local_68 & 0xff000000) << 8 | ((ulong)local_68 & 0xff0000) << 0x18
                          | ((ulong)local_68 & 0xff00) << 0x28 | (long)local_68 << 0x38);
      std::any::operator=(v,(unsigned_long *)&local_70);
    }
    break;
  case 0xd0:
    plVar8 = (long *)std::istream::read((char *)input,(long)local_68);
    bVar13 = *(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) == 0;
    if (bVar13) {
      std::any::operator=(v,local_68);
    }
    break;
  case 0xd1:
    plVar8 = (long *)std::istream::read((char *)input,(long)local_68);
    bVar13 = *(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) == 0;
    if (bVar13) {
      local_70 = (double)CONCAT62(local_70._2_6_,local_68._0_2_ << 8 | (ushort)local_68._0_2_ >> 8);
      std::any::operator=(v,(short *)&local_70);
    }
    break;
  case 0xd2:
    plVar8 = (long *)std::istream::read((char *)input,(long)local_68);
    bVar13 = *(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) == 0;
    if (bVar13) {
      local_70 = (double)CONCAT44(local_70._4_4_,
                                  (uint)local_68._0_4_ >> 0x18 | (local_68._0_4_ & 0xff0000) >> 8 |
                                  (local_68._0_4_ & 0xff00) << 8 | local_68._0_4_ << 0x18);
      std::any::operator=(v,(int *)&local_70);
    }
    break;
  case 0xd3:
    plVar8 = (long *)std::istream::read((char *)input,(long)local_68);
    bVar13 = *(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) == 0;
    if (bVar13) {
      local_70 = (double)((ulong)local_68 >> 0x38 | ((ulong)local_68 & 0xff000000000000) >> 0x28 |
                          ((ulong)local_68 & 0xff0000000000) >> 0x18 |
                          ((ulong)local_68 & 0xff00000000) >> 8 |
                          ((ulong)local_68 & 0xff000000) << 8 | ((ulong)local_68 & 0xff0000) << 0x18
                          | ((ulong)local_68 & 0xff00) << 0x28 | (long)local_68 << 0x38);
      std::any::operator=(v,(long *)&local_70);
    }
    break;
  case 0xd9:
    cVar2 = std::istream::get();
    if (*(int *)(input + *(long *)(*(long *)input + -0x18) + 0x20) == 0) {
      local_68 = (undefined1  [8])&local_58;
      _Stack_60._M_ptr = (void *)0x0;
      local_58._M_allocated_capacity = local_58._M_allocated_capacity & 0xffffffffffffff00;
      std::__cxx11::string::resize((ulong)local_68,cVar2);
      plVar8 = (long *)std::istream::read((char *)input,(long)local_68);
      if (*(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) != 0) goto LAB_0012e867;
      bVar13 = true;
      std::any::operator=(v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_68);
      goto LAB_0012e8b8;
    }
    goto LAB_0012e6a3;
  case 0xda:
    plVar8 = (long *)std::istream::read((char *)input,(long)&local_70);
    if (*(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) == 0) {
      local_68 = (undefined1  [8])&local_58;
      _Stack_60._M_ptr = (void *)0x0;
      local_58._M_allocated_capacity = local_58._M_allocated_capacity & 0xffffffffffffff00;
      std::__cxx11::string::resize((ulong)local_68,(char)((ulong)local_70 >> 8));
      plVar8 = (long *)std::istream::read((char *)input,(long)local_68);
      if (*(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) == 0) {
        bVar13 = true;
        std::any::operator=(v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_68);
      }
      else {
LAB_0012f049:
        bVar13 = false;
      }
LAB_0012f18f:
      if (local_68 == (undefined1  [8])&local_58) {
        return bVar13;
      }
      goto LAB_0012e8c6;
    }
    goto LAB_0012e6a3;
  case 0xdb:
    plVar8 = (long *)std::istream::read((char *)input,(long)&local_70);
    if (*(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) == 0) {
      local_68 = (undefined1  [8])&local_58;
      _Stack_60._M_ptr = (void *)0x0;
      local_58._M_allocated_capacity = local_58._M_allocated_capacity & 0xffffffffffffff00;
      std::__cxx11::string::resize((ulong)local_68,(char)((ulong)local_70 >> 0x18));
      plVar8 = (long *)std::istream::read((char *)input,(long)local_68);
      if (*(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) != 0) goto LAB_0012f049;
      bVar13 = true;
      std::any::operator=(v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_68);
      goto LAB_0012f18f;
    }
    goto LAB_0012e6a3;
  case 0xdc:
    plVar8 = (long *)std::istream::read((char *)input,(long)&local_70);
    if (*(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) == 0) {
      std::vector<std::any,_std::allocator<std::any>_>::vector
                ((vector<std::any,_std::allocator<std::any>_> *)local_68,
                 (ulong)(ushort)(local_70._0_2_ << 8 | local_70._0_2_ >> 8),
                 (allocator_type *)&local_71);
      uVar11 = 0xffffffffffffffff;
      lVar10 = 0;
      do {
        uVar11 = uVar11 + 1;
        if ((ulong)((long)_Stack_60._M_ptr - (long)local_68 >> 4) <= uVar11) {
          bVar13 = true;
          goto LAB_0012f143;
        }
        bVar13 = deserialize(input,(any *)((long)local_68 + lVar10));
        lVar10 = lVar10 + 0x10;
      } while (bVar13);
      bVar13 = false;
LAB_0012f143:
      std::any::operator=(v,(vector<std::any,_std::allocator<std::any>_> *)local_68);
LAB_0012e807:
      std::vector<std::any,_std::allocator<std::any>_>::~vector
                ((vector<std::any,_std::allocator<std::any>_> *)local_68);
      return bVar13;
    }
    goto LAB_0012e6a3;
  case 0xdd:
    plVar8 = (long *)std::istream::read((char *)input,(long)&local_70);
    if (*(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) == 0) {
      std::vector<std::any,_std::allocator<std::any>_>::vector
                ((vector<std::any,_std::allocator<std::any>_> *)local_68,
                 (ulong)(local_70._0_4_ >> 0x18 | (local_70._0_4_ & 0xff0000) >> 8 |
                         (local_70._0_4_ & 0xff00) << 8 | local_70._0_4_ << 0x18),
                 (allocator_type *)&local_71);
      uVar11 = 0xffffffffffffffff;
      lVar10 = 0;
      do {
        uVar11 = uVar11 + 1;
        if ((ulong)((long)_Stack_60._M_ptr - (long)local_68 >> 4) <= uVar11) {
          bVar13 = true;
          goto LAB_0012f158;
        }
        bVar13 = deserialize(input,(any *)((long)local_68 + lVar10));
        lVar10 = lVar10 + 0x10;
      } while (bVar13);
      bVar13 = false;
LAB_0012f158:
      std::any::operator=(v,(vector<std::any,_std::allocator<std::any>_> *)local_68);
      goto LAB_0012e807;
    }
LAB_0012e6a3:
    bVar13 = false;
    break;
  case 0xde:
    plVar8 = (long *)std::istream::read((char *)input,(long)&local_70);
    if (*(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) != 0) goto LAB_0012e6a3;
    local_58._8_8_ = &_Stack_60;
    local_68 = (undefined1  [8])0x0;
    _Stack_60._M_ptr = (void *)0x0;
    local_58._M_allocated_capacity = 0;
    local_40 = 0;
    local_48 = (_Storage *)local_58._8_8_;
    std::any::operator=(v,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                           *)local_68);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                 *)local_68);
    if (local_70._0_2_ != 0) {
      local_38 = (ulong)(ushort)(local_70._0_2_ << 8 | local_70._0_2_ >> 8);
      uVar11 = 1;
      while( true ) {
        local_68 = (undefined1  [8])0x0;
        _Stack_60._M_ptr = (void *)0x0;
        bVar13 = deserialize(input,(any *)local_68);
        if ((bVar13) && (bVar13 = is<std::__cxx11::string>((any *)local_68), bVar13)) {
          pmVar5 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                             (v);
          pbVar6 = get<std::__cxx11::string>((any *)local_68);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                   ::operator[](pmVar5,pbVar6);
          bVar13 = deserialize(input,pmVar7);
        }
        else {
          bVar13 = false;
        }
        std::any::~any((any *)local_68);
        if (bVar13 == false) break;
        bVar12 = local_38 <= uVar11;
        uVar11 = uVar11 + 1;
        if (bVar12) {
          return bVar13;
        }
      }
      return false;
    }
    goto LAB_0012e6e4;
  case 0xdf:
    plVar8 = (long *)std::istream::read((char *)input,(long)&local_70);
    if (*(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) != 0) goto LAB_0012e6a3;
    local_58._8_8_ = &_Stack_60;
    local_68 = (undefined1  [8])0x0;
    _Stack_60._M_ptr = (void *)0x0;
    local_58._M_allocated_capacity = 0;
    local_40 = 0;
    local_48 = (_Storage *)local_58._8_8_;
    std::any::operator=(v,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                           *)local_68);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                 *)local_68);
    if (local_70._0_4_ != 0) {
      local_38 = (ulong)(local_70._0_4_ >> 0x18 | (local_70._0_4_ & 0xff0000) >> 8 |
                         (local_70._0_4_ & 0xff00) << 8 | local_70._0_4_ << 0x18);
      uVar11 = 1;
      while( true ) {
        local_68 = (undefined1  [8])0x0;
        _Stack_60._M_ptr = (void *)0x0;
        bVar13 = deserialize(input,(any *)local_68);
        if ((bVar13) && (bVar13 = is<std::__cxx11::string>((any *)local_68), bVar13)) {
          pmVar5 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                             (v);
          pbVar6 = get<std::__cxx11::string>((any *)local_68);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                   ::operator[](pmVar5,pbVar6);
          bVar13 = deserialize(input,pmVar7);
        }
        else {
          bVar13 = false;
        }
        std::any::~any((any *)local_68);
        if (bVar13 == false) break;
        bVar12 = local_38 <= uVar11;
        uVar11 = uVar11 + 1;
        if (bVar12) {
          return bVar13;
        }
      }
      return false;
    }
LAB_0012e6e4:
    bVar13 = true;
  }
  return bVar13;
}

Assistant:

bool msgpack::deserialize(std::istream& input, any& v)
  {
    unsigned int typeByte = static_cast<unsigned int>(0xFF & input.get());
    bool ret = input.good();
    if (ret)
    {
      if (/*typeByte >= 0x00 &&*/ typeByte <= 0x7F) // positive fixint 0xxxxxxx
      {
        v = std::uint8_t(0x7F & typeByte);
      }
      else if (typeByte >= 0xE0 && typeByte <= 0xFF) // negative fixint	111xxxxx
      {
        v = std::int8_t((0x1F & typeByte ) * -1);
      }
      else if (typeByte >= 0x80 && typeByte <= 0x8F) // fixmap	1000xxxx
      {
        std::size_t sz(0x0F & typeByte);
        v = goodform::object_t();
        for (size_t i = 0; i < sz; ++i)
        {
          any key;
          if (!msgpack::deserialize(input, key) || !is<std::string>(key)) // Only supporting string keys.
            ret = false;
          else
            ret = msgpack::deserialize(input, get<object_t>(v)[get<std::string>(key)]);
        }
      }
      else if (typeByte >= 0x90 && typeByte <= 0x9F) // fixarray	1001xxxx
      {
        std::size_t sz(0x0F & typeByte);
        goodform::array_t a(sz);
        for (size_t i = 0; i < sz; ++i)
          msgpack::deserialize(input, a[i]);
        v = std::move(a);
      }
      else if (typeByte >= 0xA0 && typeByte <= 0xBF) // fixstr	101xxxxx
      {
        std::size_t sz(0x1F & typeByte);
        std::string s;
        s.resize(sz);
        input.read(&s[0], sz);
        if (!input.good())
          ret = false;
        else
          v = std::move(s);
      }
      else if (typeByte == 0xC0) // null
      {
        v = nullptr;
      }
      else if (typeByte == 0xC2) // false
      {
        v = false;
      }
      else if (typeByte == 0xC3) // true
      {
        v = true;
      }
      else if (typeByte == 0xC4) // Bin 8
      {
        std::size_t sz (0xFF & static_cast<unsigned int>(input.get()));
        ret = input.good();
        if (ret)
        {
          goodform::binary_t b(sz);
          if (!input.read(b.data(), sz).good())
            ret = false;
          else
            v = std::move(b);
        }
      }
      else if (typeByte == 0xC5) // Bin 16
      {
        std::uint16_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          goodform::binary_t b(be16toh(sz_be));
          if (!input.read(b.data(), b.size()).good())
            ret = false;
          else
            v = std::move(b);
        }
      }
      else if (typeByte == 0xC6) // Bin 32
      {
        std::uint32_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          goodform::binary_t b(be32toh(sz_be));
          if (!input.read(b.data(), b.size()).good())
            ret = false;
          else
            v = std::move(b);
        }
      }
      else if (typeByte == 0xCA) // Float 32
      {
        std::uint32_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          numeric_union32 u;
          u.i = be32toh(be);
          v = u.f;
        }
      }
      else if (typeByte == 0xCB) // Float 64
      {
        std::uint64_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          numeric_union64 u;
          u.i = be64toh(be);
          v = u.f;
        }
      }
      else if (typeByte == 0xCC) // Uint 8
      {
        std::uint8_t val;
        ret = input.read((char*)&val, sizeof(val)).good();
        if (ret)
          v = val;
      }
      else if (typeByte == 0xCD) // Uint 16
      {
        std::uint16_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          std::uint16_t val(be16toh(be));
          v = val;
        }
      }
      else if (typeByte == 0xCE) // Uint 32
      {
        std::uint32_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          std::uint32_t val(be32toh(be));
          v = val;
        }
      }
      else if (typeByte == 0xCF) // Uint 64
      {
        std::uint64_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          std::uint64_t val(be64toh(be));
          v = val;
        }
      }
      else if (typeByte == 0xD0) // Int 8
      {
        std::int8_t val;
        ret = input.read((char*)&val, sizeof(val)).good();
        if (ret)
          v = val;
      }
      else if (typeByte == 0xD1) // Int 16
      {
        std::int16_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          std::int16_t val(be16toh(be));
          v = val;
        }
      }
      else if (typeByte == 0xD2) // Int 32
      {
        std::int32_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          std::int32_t val(be32toh(be));
          v = val;
        }
      }
      else if (typeByte == 0xD3) // Int 64
      {
        std::int64_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          std::int64_t val(be64toh(be));
          v = val;
        }
      }
      else if (typeByte == 0xD9) // str 8
      {
        std::size_t sz(0xFF & static_cast<unsigned int>(input.get()));
        ret = input.good();
        if (ret)
        {
          std::string s;
          s.resize(sz);
          if (!input.read(&s[0], sz).good())
            ret = false;
          else
            v = std::move(s);
        }
      }
      else if (typeByte == 0xDA) // str 16
      {
        std::uint16_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          std::string s;
          s.resize(be16toh(sz_be));
          if (!input.read(&s[0], s.size()).good())
            ret = false;
          else
            v = std::move(s);
        }
      }
      else if (typeByte == 0xDB) // str 32
      {
        std::uint32_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          std::string s;
          s.resize(be32toh(sz_be));
          if (!input.read(&s[0], s.size()).good())
            ret = false;
          else
            v = std::move(s);
        }
      }
      else if (typeByte == 0xDC) // array 16
      {
        std::uint16_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          goodform::array_t a(be16toh(sz_be));
          for (size_t i = 0; ret && i < a.size(); ++i)
            ret = msgpack::deserialize(input, a[i]);
          v = std::move(a);
        }
      }
      else if (typeByte == 0xDD) // array 32
      {
        std::uint32_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          goodform::array_t a(be32toh(sz_be));
          for (size_t i = 0; ret && i < a.size(); ++i)
            ret = msgpack::deserialize(input, a[i]);
          v = std::move(a);
        }
      }
      else if (typeByte == 0xDE) // map 16
      {
        std::uint16_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          v = object_t();
          std::uint16_t sz(be16toh(sz_be));
          for (size_t i = 0; ret && i < sz; ++i)
          {
            any key;
            if (!msgpack::deserialize(input, key) || !is<std::string>(key)) // Only supporting string keys.
              ret = false;
            else
              ret = msgpack::deserialize(input, get<object_t>(v)[get<std::string>(key)]);
          }
        }
      }
      else if (typeByte == 0xDF) // map 32
      {
        std::uint32_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          v = object_t();
          std::uint32_t sz(be32toh(sz_be));
          for (size_t i = 0; ret && i < sz; ++i)
          {
            any key;
            if (!msgpack::deserialize(input, key) || !is<std::string>(key)) // Only supporting string keys.
              ret = false;
            else
              ret = msgpack::deserialize(input, get<object_t>(v)[get<std::string>(key)]);
          }
        }
      }
      else // Not Supported
      {
        ret = false;
      }
    }

    return ret;
  }